

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::execute
          (ComputeShaderExecutor *this,int numValues,void **inputs,void **outputs)

{
  pointer pVVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int iVar6;
  deUint32 dVar7;
  deUint32 local_48;
  long lVar5;
  
  iVar3 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pVVar1 = (this->super_BufferIoExecutor).m_inputLayout.
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = 0;
  dVar7 = 0;
  if (pVVar1 != (this->super_BufferIoExecutor).m_inputLayout.
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar7 = pVVar1->stride;
  }
  pVVar1 = (this->super_BufferIoExecutor).m_outputLayout.
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->super_BufferIoExecutor).m_outputLayout.
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_48 = pVVar1->stride;
  }
  iVar3 = (this->m_maxWorkSize).m_data[0];
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  if (0 < numValues) {
    iVar6 = 0;
    do {
      iVar2 = numValues - iVar6;
      if (iVar3 < numValues - iVar6) {
        iVar2 = iVar3;
      }
      if (dVar7 != 0) {
        (**(code **)(lVar5 + 0x50))
                  (0x90d2,0,(this->super_BufferIoExecutor).m_inputBuffer.super_ObjectWrapper.
                            m_object,iVar6 * dVar7,iVar2 * dVar7);
      }
      (**(code **)(lVar5 + 0x50))
                (0x90d2,1,(this->super_BufferIoExecutor).m_outputBuffer.super_ObjectWrapper.m_object
                 ,iVar6 * local_48,iVar2 * local_48);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindBufferRange(GL_SHADER_STORAGE_BUFFER)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x4cc);
      (**(code **)(lVar5 + 0x528))(iVar2,1,1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glDispatchCompute()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x4cf);
      iVar6 = iVar6 + iVar2;
    } while (iVar6 < numValues);
  }
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void ComputeShaderExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl						= m_renderCtx.getFunctions();
	const int				maxValuesPerInvocation	= m_maxWorkSize[0];
	const deUint32			inputStride				= getInputStride();
	const deUint32			outputStride			= getOutputStride();

	initBuffers(numValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	// Perform compute invocations
	{
		int curOffset = 0;
		while (curOffset < numValues)
		{
			const int numToExec = de::min(maxValuesPerInvocation, numValues-curOffset);

			if (inputStride > 0)
				gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer(), curOffset*inputStride, numToExec*inputStride);

			gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer(), curOffset*outputStride, numToExec*outputStride);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_SHADER_STORAGE_BUFFER)");

			gl.dispatchCompute(numToExec, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

			curOffset += numToExec;
		}
	}

	// Read back data
	readOutputBuffer(outputs, numValues);
}